

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1554.c
# Opt level: O0

int test(char *URL)

{
  undefined8 uVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  CURL *curl;
  CURLcode ec;
  int i;
  CURLSH *share;
  CURLcode res;
  char *URL_local;
  
  share._4_4_ = 0;
  iVar2 = curl_global_init(3);
  uVar1 = _stderr;
  if (iVar2 != 0) {
    uVar3 = curl_easy_strerror(iVar2);
    curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1554.c"
                  ,0x32,iVar2,uVar3);
    share._4_4_ = iVar2;
  }
  if (share._4_4_ == 0) {
    lVar4 = curl_share_init();
    if (lVar4 == 0) {
      curl_mfprintf(_stderr,"curl_share_init() failed\n");
      curl_global_cleanup();
      URL_local._4_4_ = 0x7e;
    }
    else {
      curl_share_setopt(lVar4,1,5);
      curl_share_setopt(lVar4,3,my_lock);
      curl_share_setopt(lVar4,4,my_unlock);
      for (curl._4_4_ = 0; curl._4_4_ < 3; curl._4_4_ = curl._4_4_ + 1) {
        lVar5 = curl_easy_init();
        if (lVar5 != 0) {
          curl_easy_setopt(lVar5,0x2712,URL);
          curl_easy_setopt(lVar5,0x2774,lVar4);
          iVar2 = curl_easy_perform(lVar5);
          uVar1 = _stderr;
          if (iVar2 != 0) {
            uVar3 = curl_easy_strerror(iVar2);
            curl_mfprintf(uVar1,"curl_easy_perform() failed: %s\n",uVar3);
          }
          curl_easy_cleanup(lVar5);
        }
      }
      curl_share_cleanup(lVar4);
      curl_global_cleanup();
      URL_local._4_4_ = 0;
    }
  }
  else {
    URL_local._4_4_ = share._4_4_;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  CURLcode res = CURLE_OK;
  CURLSH *share;
  int i;

  global_init(CURL_GLOBAL_ALL);

  share = curl_share_init();
  if(!share) {
    fprintf(stderr, "curl_share_init() failed\n");
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  curl_share_setopt(share, CURLSHOPT_SHARE, CURL_LOCK_DATA_CONNECT);
  curl_share_setopt(share, CURLSHOPT_LOCKFUNC, my_lock);
  curl_share_setopt(share, CURLSHOPT_UNLOCKFUNC, my_unlock);

  /* Loop the transfer and cleanup the handle properly every lap. This will
     still reuse connections since the pool is in the shared object! */

  for(i = 0; i < 3; i++) {
    CURL *curl = curl_easy_init();
    if(curl) {
      curl_easy_setopt(curl, CURLOPT_URL, URL);

      /* use the share object */
      curl_easy_setopt(curl, CURLOPT_SHARE, share);

      /* Perform the request, res will get the return code */
      res = curl_easy_perform(curl);
      /* Check for errors */
      if(res != CURLE_OK)
        fprintf(stderr, "curl_easy_perform() failed: %s\n",
                curl_easy_strerror(res));

      /* always cleanup */
      curl_easy_cleanup(curl);
    }
  }

  curl_share_cleanup(share);
  curl_global_cleanup();

  return 0;
}